

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::InitializeDioOption(DioOption *option)

{
  DioOption *option_local;
  
  option->channels_in_octave = 2.0;
  option->f0_ceil = 800.0;
  option->f0_floor = 71.0;
  option->frame_period = 5.0;
  option->speed = 1;
  option->allowed_range = 0.1;
  return;
}

Assistant:

void InitializeDioOption(DioOption *option) {
  // You can change default parameters.
  option->channels_in_octave = 2.0;
  option->f0_ceil = world::kCeilF0;
  option->f0_floor = world::kFloorF0;
  option->frame_period = 5;

  // You can use the value from 1 to 12.
  // Default value 11 is for the fs of 44.1 kHz.
  // The lower value you use, the better performance you can obtain.
  option->speed = 1;

  // You can give a positive real number as the threshold.
  // The most strict value is 0, and there is no upper limit.
  // On the other hand, I think that the value from 0.02 to 0.2 is reasonable.
  option->allowed_range = 0.1;
}